

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O2

void ucm_printTable(UCMTable *table,FILE *f,UBool byUnicode)

{
  uint uVar1;
  int32_t *piVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  UCMapping *m;
  bool bVar6;
  
  m = table->mappings;
  uVar1 = table->mappingsLength;
  if (byUnicode == '\0') {
    piVar2 = table->reverseMap;
    uVar4 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      ucm_printMapping(table,m + piVar2[uVar4],f);
    }
  }
  else {
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
      ucm_printMapping(table,m,f);
      m = m + 1;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucm_printTable(UCMTable *table, FILE *f, UBool byUnicode) {
    UCMapping *m;
    int32_t i, length;

    m=table->mappings;
    length=table->mappingsLength;
    if(byUnicode) {
        for(i=0; i<length; ++m, ++i) {
            ucm_printMapping(table, m, f);
        }
    } else {
        const int32_t *map=table->reverseMap;
        for(i=0; i<length; ++i) {
            ucm_printMapping(table, m+map[i], f);
        }
    }
}